

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_write_mct_data_group
                   (opj_j2k_t *p_j2k,opj_stream_private *p_stream,opj_event_mgr *p_manager)

{
  opj_image_t *poVar1;
  opj_tcp_t *poVar2;
  OPJ_BYTE *pOVar3;
  OPJ_SIZE_T OVar4;
  char *fmt;
  int iVar5;
  OPJ_UINT32 *pOVar6;
  opj_simple_mcc_decorrelation_data_t *poVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  OPJ_UINT32 OVar13;
  long lVar14;
  bool bVar15;
  uint local_40;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x14af,
                  "OPJ_BOOL opj_j2k_write_mct_data_group(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_stream == (opj_stream_private *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x14b0,
                  "OPJ_BOOL opj_j2k_write_mct_data_group(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_manager == (opj_event_mgr *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x14b1,
                  "OPJ_BOOL opj_j2k_write_mct_data_group(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  pOVar3 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
  poVar1 = p_j2k->m_private_image;
  OVar13 = poVar1->numcomps;
  uVar8 = OVar13 + 6;
  uVar10 = (ulong)uVar8;
  if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar8) {
    pOVar3 = (OPJ_BYTE *)opj_realloc(pOVar3,uVar10);
    if (pOVar3 == (OPJ_BYTE *)0x0) {
      opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
      (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
      (p_j2k->m_specific_param).m_decoder.m_last_tile_part = 0;
      fmt = "Not enough memory to write CBD marker\n";
LAB_0011bab7:
      opj_event_msg(p_manager,1,fmt);
      return 0;
    }
    (p_j2k->m_specific_param).m_encoder.m_header_tile_data = pOVar3;
    (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar8;
  }
  opj_write_bytes_LE(pOVar3,0xff78,2);
  opj_write_bytes_LE(pOVar3 + 2,OVar13 + 4,2);
  opj_write_bytes_LE(pOVar3 + 4,poVar1->numcomps,2);
  if (poVar1->numcomps != 0) {
    pOVar6 = &poVar1->comps->sgnd;
    lVar14 = 0;
    do {
      opj_write_bytes_LE(pOVar3 + lVar14 + 6,pOVar6[-2] - 1 | *pOVar6 << 7,1);
      pOVar6 = pOVar6 + 0x10;
      lVar14 = lVar14 + 1;
    } while ((uint)lVar14 < poVar1->numcomps);
  }
  OVar4 = opj_stream_write_data
                    (p_stream,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,uVar10,
                     p_manager);
  if (OVar4 == uVar10) {
    poVar2 = (p_j2k->m_cp).tcps;
    uVar8 = p_j2k->m_current_tile_number;
    if (poVar2[uVar8].m_nb_mct_records != 0) {
      pOVar6 = &(poVar2[uVar8].m_mct_records)->m_data_size;
      uVar12 = 0;
      do {
        uVar9 = *pOVar6;
        uVar11 = uVar9 + 10;
        uVar10 = (ulong)uVar11;
        pOVar3 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
        if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar11) {
          pOVar3 = (OPJ_BYTE *)opj_realloc(pOVar3,uVar10);
          if (pOVar3 == (OPJ_BYTE *)0x0) {
            opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
            (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
            (p_j2k->m_specific_param).m_decoder.m_last_tile_part = 0;
            fmt = "Not enough memory to write MCT marker\n";
            goto LAB_0011bab7;
          }
          (p_j2k->m_specific_param).m_encoder.m_header_tile_data = pOVar3;
          (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar11;
        }
        opj_write_bytes_LE(pOVar3,0xff74,2);
        opj_write_bytes_LE(pOVar3 + 2,uVar9 + 8,2);
        opj_write_bytes_LE(pOVar3 + 4,0,2);
        opj_write_bytes_LE(pOVar3 + 6,
                           ((opj_mct_data_t *)(pOVar6 + -6))->m_element_type << 10 |
                           pOVar6[-5] << 8 | (uint)(byte)pOVar6[-4],2);
        opj_write_bytes_LE(pOVar3 + 8,0,2);
        memcpy(pOVar3 + 10,*(OPJ_BYTE **)(pOVar6 + -2),(ulong)*pOVar6);
        OVar4 = opj_stream_write_data
                          (p_stream,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,uVar10,
                           p_manager);
        if (OVar4 != uVar10) {
          return 0;
        }
        uVar12 = uVar12 + 1;
        pOVar6 = pOVar6 + 8;
      } while (uVar12 < poVar2[uVar8].m_nb_mct_records);
    }
    if (poVar2[uVar8].m_nb_mcc_records != 0) {
      poVar7 = poVar2[uVar8].m_mcc_records;
      uVar12 = 0;
      do {
        bVar15 = 0xff < poVar7->m_nb_comps;
        iVar5 = poVar7->m_nb_comps * 2 << bVar15;
        uVar11 = iVar5 + 0x13;
        pOVar3 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
        uVar10 = (ulong)uVar11;
        if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar11) {
          pOVar3 = (OPJ_BYTE *)opj_realloc(pOVar3,uVar10);
          if (pOVar3 == (OPJ_BYTE *)0x0) {
            opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
            (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
            (p_j2k->m_specific_param).m_decoder.m_last_tile_part = 0;
            fmt = "Not enough memory to write MCC marker\n";
            goto LAB_0011bab7;
          }
          (p_j2k->m_specific_param).m_encoder.m_header_tile_data = pOVar3;
          (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar11;
        }
        uVar9 = bVar15 + 1;
        local_40 = (uint)bVar15 << 0xf;
        opj_write_bytes_LE(pOVar3,0xff75,2);
        opj_write_bytes_LE(pOVar3 + 2,iVar5 + 0x11,2);
        uVar11 = 0;
        opj_write_bytes_LE(pOVar3 + 4,0,2);
        opj_write_bytes_LE(pOVar3 + 6,poVar7->m_index,1);
        opj_write_bytes_LE(pOVar3 + 7,0,2);
        opj_write_bytes_LE(pOVar3 + 9,1,2);
        opj_write_bytes_LE(pOVar3 + 0xb,1,1);
        opj_write_bytes_LE(pOVar3 + 0xc,poVar7->m_nb_comps | (uint)bVar15 << 0xf,2);
        pOVar3 = pOVar3 + 0xe;
        if (poVar7->m_nb_comps != 0) {
          OVar13 = 0;
          do {
            opj_write_bytes_LE(pOVar3,OVar13,uVar9);
            pOVar3 = pOVar3 + uVar9;
            OVar13 = OVar13 + 1;
            uVar11 = poVar7->m_nb_comps;
          } while (OVar13 < uVar11);
        }
        opj_write_bytes_LE(pOVar3,uVar11 | local_40,2);
        pOVar3 = pOVar3 + 2;
        if (poVar7->m_nb_comps != 0) {
          OVar13 = 0;
          do {
            opj_write_bytes_LE(pOVar3,OVar13,uVar9);
            pOVar3 = pOVar3 + uVar9;
            OVar13 = OVar13 + 1;
          } while (OVar13 < poVar7->m_nb_comps);
        }
        OVar13 = (~*(uint *)&poVar7->field_0x18 & 1) << 0x10;
        if (poVar7->m_decorrelation_array != (opj_mct_data_t *)0x0) {
          OVar13 = OVar13 | poVar7->m_decorrelation_array->m_index;
        }
        if (poVar7->m_offset_array != (opj_mct_data_t *)0x0) {
          OVar13 = OVar13 | poVar7->m_offset_array->m_index << 8;
        }
        opj_write_bytes_LE(pOVar3,OVar13,3);
        OVar4 = opj_stream_write_data
                          (p_stream,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,uVar10,
                           p_manager);
        if (OVar4 != uVar10) {
          return 0;
        }
        poVar7 = poVar7 + 1;
        uVar12 = uVar12 + 1;
      } while (uVar12 < poVar2[uVar8].m_nb_mcc_records);
    }
    pOVar3 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
    poVar2 = (p_j2k->m_cp).tcps;
    uVar12 = p_j2k->m_current_tile_number;
    OVar13 = poVar2[uVar12].m_nb_mcc_records;
    uVar8 = OVar13 + 5;
    uVar10 = (ulong)uVar8;
    if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar8) {
      pOVar3 = (OPJ_BYTE *)opj_realloc(pOVar3,uVar10);
      if (pOVar3 == (OPJ_BYTE *)0x0) {
        opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
        (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
        (p_j2k->m_specific_param).m_decoder.m_last_tile_part = 0;
        opj_event_msg(p_manager,1,"Not enough memory to write MCO marker\n");
        return 0;
      }
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data = pOVar3;
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar8;
    }
    opj_write_bytes_LE(pOVar3,0xff77,2);
    opj_write_bytes_LE(pOVar3 + 2,OVar13 + 3,2);
    opj_write_bytes_LE(pOVar3 + 4,poVar2[uVar12].m_nb_mcc_records,1);
    if (poVar2[uVar12].m_nb_mcc_records != 0) {
      poVar7 = poVar2[uVar12].m_mcc_records;
      lVar14 = 0;
      do {
        opj_write_bytes_LE(pOVar3 + lVar14 + 5,poVar7->m_index,1);
        poVar7 = poVar7 + 1;
        lVar14 = lVar14 + 1;
      } while ((uint)lVar14 < poVar2[uVar12].m_nb_mcc_records);
    }
    OVar4 = opj_stream_write_data
                      (p_stream,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,uVar10,
                       p_manager);
    if (OVar4 == uVar10) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static OPJ_BOOL opj_j2k_write_mct_data_group(opj_j2k_t *p_j2k,
        struct opj_stream_private *p_stream,
        struct opj_event_mgr * p_manager)
{
    OPJ_UINT32 i;
    opj_simple_mcc_decorrelation_data_t * l_mcc_record;
    opj_mct_data_t * l_mct_record;
    opj_tcp_t * l_tcp;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_stream != 00);
    assert(p_manager != 00);

    if (! opj_j2k_write_cbd(p_j2k, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    l_tcp = &(p_j2k->m_cp.tcps[p_j2k->m_current_tile_number]);
    l_mct_record = l_tcp->m_mct_records;

    for (i = 0; i < l_tcp->m_nb_mct_records; ++i) {

        if (! opj_j2k_write_mct_record(p_j2k, l_mct_record, p_stream, p_manager)) {
            return OPJ_FALSE;
        }

        ++l_mct_record;
    }

    l_mcc_record = l_tcp->m_mcc_records;

    for (i = 0; i < l_tcp->m_nb_mcc_records; ++i) {

        if (! opj_j2k_write_mcc_record(p_j2k, l_mcc_record, p_stream, p_manager)) {
            return OPJ_FALSE;
        }

        ++l_mcc_record;
    }

    if (! opj_j2k_write_mco(p_j2k, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}